

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O1

Camera * vera::createCamera(string *_name)

{
  uint uVar1;
  uint uVar2;
  iterator iVar3;
  Camera *this;
  mapped_type *ppCVar4;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
                  *)(scene + 0x98),_name);
  if (iVar3._M_node == (_Base_ptr)(scene + 0xa0)) {
    this = (Camera *)operator_new(0x260);
    Camera::Camera(this);
    ppCVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Camera_*>_>_>
                            *)(scene + 0x98),_name);
    *ppCVar4 = this;
  }
  else {
    this = *(Camera **)(iVar3._M_node + 2);
  }
  uVar1 = getWindowWidth();
  uVar2 = getWindowHeight();
  (*(this->super_Node)._vptr_Node[0x3e])(this,(ulong)uVar1,(ulong)uVar2);
  glEnable(0xb71);
  return this;
}

Assistant:

Camera* createCamera(const std::string& _name) {
    Camera* cam;
    CamerasMap::iterator it = scene->cameras.find(_name);
    if (it == scene->cameras.end()) {
        cam = new Camera();
        scene->cameras[_name] = cam;
    }
    else 
        cam = it->second;

    cam->setViewport(getWindowWidth(), getWindowHeight());
    glEnable(GL_DEPTH_TEST);
    return cam;
}